

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_parser.c
# Opt level: O0

uint8_t * apx_attributeParser_parse_single_port_attribute
                    (apx_attributeParser_t *self,uint8_t *begin,uint8_t *end,
                    apx_portAttributes_t *attr)

{
  uint8_t uVar1;
  uint8_t *local_48;
  uint8_t *result;
  apx_attributeParseType_t attribute_type;
  uint8_t *puStack_38;
  char c;
  uint8_t *next;
  apx_portAttributes_t *attr_local;
  uint8_t *end_local;
  uint8_t *begin_local;
  apx_attributeParser_t *self_local;
  
  uVar1 = *begin;
  if (uVar1 == '=') {
    result._6_1_ = '\x03';
  }
  else if (uVar1 == 'P') {
    result._6_1_ = '\x04';
  }
  else if (uVar1 == 'Q') {
    result._6_1_ = '\x05';
  }
  else {
    result._6_1_ = '\0';
  }
  if (result._6_1_ == '\0') {
    apx_attributeParser_set_error(self,3,begin);
    puStack_38 = (uint8_t *)0x0;
  }
  else {
    if (result._6_1_ == '\x03') {
      local_48 = apx_attributeParser_parse_initializer(self,begin + 1,end,&attr->init_value);
    }
    else if (result._6_1_ == '\x04') {
      local_48 = begin + 1;
      attr->is_parameter = true;
    }
    else {
      if (result._6_1_ != '\x05') {
        apx_attributeParser_set_error(self,6,(uint8_t *)0x0);
        return (uint8_t *)0x0;
      }
      local_48 = apx_attributeParser_parse_array_length(begin + 1,end,&attr->queue_length);
    }
    if (begin < local_48) {
      puStack_38 = local_48;
    }
    else {
      apx_attributeParser_set_error(self,3,begin);
      puStack_38 = (uint8_t *)0x0;
    }
  }
  return puStack_38;
}

Assistant:

static uint8_t const* apx_attributeParser_parse_single_port_attribute(apx_attributeParser_t* self, uint8_t const* begin, uint8_t const* end, apx_portAttributes_t* attr)
{
   uint8_t const* next = begin;
   char c = *next;
   apx_attributeParseType_t attribute_type = APX_ATTRIBUTE_PARSE_TYPE_NONE;
   switch (c)
   {
   case '=':
      attribute_type = APX_ATTRIBUTE_PARSE_TYPE_INIT_VALUE;
      break;
   case 'P':
      attribute_type = APX_ATTRIBUTE_PARSE_TYPE_PARAMETER;
      break;
   case 'Q':
      attribute_type = APX_ATTRIBUTE_PARSE_TYPE_QUEUE_LENGTH;
      break;
   default:
      attribute_type = APX_ATTRIBUTE_PARSE_TYPE_NONE;
   }
   if (attribute_type != APX_ATTRIBUTE_PARSE_TYPE_NONE)
   {
      uint8_t const* result = NULL;
      switch (attribute_type)
      {
      case APX_ATTRIBUTE_PARSE_TYPE_INIT_VALUE:
         result = apx_attributeParser_parse_initializer(self, next + 1, end, &attr->init_value);
         break;
      case APX_ATTRIBUTE_PARSE_TYPE_PARAMETER:
         result = next + 1;
         attr->is_parameter = true;
         break;
      case APX_ATTRIBUTE_PARSE_TYPE_QUEUE_LENGTH:
         result = apx_attributeParser_parse_array_length(next + 1, end, &attr->queue_length);
         break;
      default:
         apx_attributeParser_set_error(self, APX_INTERNAL_ERROR, NULL);
         return NULL;
      }
      if (result > next)
      {
         next = result;
      }
      else
      {
         apx_attributeParser_set_error(self, APX_PARSE_ERROR, next);
         next = NULL;
      }
   }
   else
   {
      apx_attributeParser_set_error(self, APX_PARSE_ERROR, next);
      next = NULL;
   }
   return next;

}